

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O3

int uv_decode(double *up,double *vp,int c)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  
  iVar3 = -1;
  if ((uint)c < 0x3fa1) {
    iVar3 = 0xa3;
    iVar2 = 0;
    do {
      iVar4 = iVar2 + iVar3 >> 1;
      lVar5 = (long)iVar4;
      iVar1 = iVar4;
      if ((c <= uv_row[lVar5].ncum) && (iVar1 = iVar2, iVar3 = iVar4, -1 < c - uv_row[lVar5].ncum))
      goto LAB_002a5eae;
      iVar2 = iVar1;
    } while (1 < iVar3 - iVar2);
    lVar5 = (long)iVar2;
    iVar4 = iVar2;
LAB_002a5eae:
    *up = ((double)(c - uv_row[lVar5].ncum) + 0.5) * 0.0035000001080334187 +
          (double)uv_row[lVar5].ustart;
    *vp = ((double)iVar4 + 0.5) * 0.0035000001080334187 + 0.016939999535679817;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int
    uv_decode(double *up, double *vp, int c) /* decode (u',v') index */
{
    int upper, lower;
    register int ui, vi;

    if (c < 0 || c >= UV_NDIVS)
        return (-1);
    lower = 0; /* binary search */
    upper = UV_NVS;
    while (upper - lower > 1)
    {
        vi = (lower + upper) >> 1;
        ui = c - uv_row[vi].ncum;
        if (ui > 0)
            lower = vi;
        else if (ui < 0)
            upper = vi;
        else
        {
            lower = vi;
            break;
        }
    }
    vi = lower;
    ui = c - uv_row[vi].ncum;
    *up = uv_row[vi].ustart + (ui + .5) * UV_SQSIZ;
    *vp = UV_VSTART + (vi + .5) * UV_SQSIZ;
    return (0);
}